

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtCore.c
# Opt level: O0

Vec_Vec_t *
Cgt_ClockGatingCandidates(Aig_Man_t *pAig,Aig_Man_t *pCare,Cgt_Par_t *pPars,Vec_Int_t *vUseful)

{
  Vec_Vec_t *pVVar1;
  FILE *pFile;
  int iVar2;
  int iVar3;
  abctime aVar4;
  abctime aVar5;
  Cgt_Man_t *p_00;
  Aig_Man_t *pAVar6;
  abctime aVar7;
  abctime clkTotal;
  abctime clk;
  int iStart;
  Vec_Vec_t *vGatesAll;
  Cgt_Man_t *p;
  Cgt_Par_t Pars;
  Bar_Progress_t *pProgress;
  Vec_Int_t *vUseful_local;
  Cgt_Par_t *pPars_local;
  Aig_Man_t *pCare_local;
  Aig_Man_t *pAig_local;
  
  Pars.fVerbose = 0;
  Pars.fVeryVerbose = 0;
  aVar4 = Abc_Clock();
  aVar5 = Abc_Clock();
  Aig_ManRandom(1);
  vUseful_local = (Vec_Int_t *)pPars;
  if (pPars == (Cgt_Par_t *)0x0) {
    vUseful_local = (Vec_Int_t *)((long)&p + 4);
    Cgt_SetDefaultParams((Cgt_Par_t *)((long)&p + 4));
  }
  p_00 = Cgt_ManCreate(pAig,pCare,(Cgt_Par_t *)vUseful_local);
  p_00->vUseful = vUseful;
  pAVar6 = Cgt_ManDeriveAigForGating(p_00);
  p_00->pFrame = pAVar6;
  aVar7 = Abc_Clock();
  p_00->timeAig = (aVar7 - aVar4) + p_00->timeAig;
  iVar2 = Aig_ManCoNum(p_00->pFrame);
  iVar3 = Saig_ManRegNum(p_00->pAig);
  pFile = _stdout;
  if (iVar2 == iVar3) {
    iVar2 = Aig_ManCoNum(p_00->pFrame);
    Pars._28_8_ = Bar_ProgressStart(pFile,iVar2);
    clk._4_4_ = 0;
    while( true ) {
      iVar2 = Aig_ManCoNum(p_00->pFrame);
      if (iVar2 <= clk._4_4_) break;
      Bar_ProgressUpdate((Bar_Progress_t *)Pars._28_8_,clk._4_4_,(char *)0x0);
      clk._4_4_ = Cgt_ClockGatingRange(p_00,clk._4_4_);
    }
    Bar_ProgressStop((Bar_Progress_t *)Pars._28_8_);
    pVVar1 = p_00->vGatesAll;
    p_00->vGatesAll = (Vec_Vec_t *)0x0;
    aVar4 = Abc_Clock();
    p_00->timeTotal = aVar4 - aVar5;
    Cgt_ManStop(p_00);
    return pVVar1;
  }
  __assert_fail("Aig_ManCoNum(p->pFrame) == Saig_ManRegNum(p->pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cgt/cgtCore.c"
                ,0x105,
                "Vec_Vec_t *Cgt_ClockGatingCandidates(Aig_Man_t *, Aig_Man_t *, Cgt_Par_t *, Vec_Int_t *)"
               );
}

Assistant:

Vec_Vec_t * Cgt_ClockGatingCandidates( Aig_Man_t * pAig, Aig_Man_t * pCare, Cgt_Par_t * pPars, Vec_Int_t * vUseful )
{
    Bar_Progress_t * pProgress = NULL;
    Cgt_Par_t Pars; 
    Cgt_Man_t * p;
    Vec_Vec_t * vGatesAll;
    int iStart;
    abctime clk = Abc_Clock(), clkTotal = Abc_Clock();
    // reset random numbers
    Aig_ManRandom( 1 );
    if ( pPars == NULL )
        Cgt_SetDefaultParams( pPars = &Pars );    
    p = Cgt_ManCreate( pAig, pCare, pPars );
    p->vUseful = vUseful;
    p->pFrame = Cgt_ManDeriveAigForGating( p );
p->timeAig += Abc_Clock() - clk;
    assert( Aig_ManCoNum(p->pFrame) == Saig_ManRegNum(p->pAig) );
    pProgress = Bar_ProgressStart( stdout, Aig_ManCoNum(p->pFrame) );
    for ( iStart = 0; iStart < Aig_ManCoNum(p->pFrame); )
    {
        Bar_ProgressUpdate( pProgress, iStart, NULL );
        iStart = Cgt_ClockGatingRange( p, iStart );
    }
    Bar_ProgressStop( pProgress );
    vGatesAll = p->vGatesAll;
    p->vGatesAll = NULL;
p->timeTotal = Abc_Clock() - clkTotal;
    Cgt_ManStop( p );
    return vGatesAll;
}